

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Envelope::clock_envelope(Nes_Envelope *this)

{
  int iVar1;
  uint uVar2;
  int period;
  Nes_Envelope *this_local;
  
  uVar2 = (this->super_Nes_Osc).regs[0] & 0xf;
  if (((this->super_Nes_Osc).reg_written[3] & 1U) == 0) {
    iVar1 = this->env_delay + -1;
    this->env_delay = iVar1;
    if ((iVar1 < 0) &&
       (this->env_delay = uVar2, this->envelope != 0 || ((this->super_Nes_Osc).regs[0] & 0x20) != 0)
       ) {
      this->envelope = this->envelope - 1U & 0xf;
    }
  }
  else {
    (this->super_Nes_Osc).reg_written[3] = false;
    this->env_delay = uVar2;
    this->envelope = 0xf;
  }
  return;
}

Assistant:

void Nes_Envelope::clock_envelope()
{
	int period = regs [0] & 15;
	if ( reg_written [3] ) {
		reg_written [3] = false;
		env_delay = period;
		envelope = 15;
	}
	else if ( --env_delay < 0 ) {
		env_delay = period;
		if ( envelope | (regs [0] & 0x20) )
			envelope = (envelope - 1) & 15;
	}
}